

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

void __thiscall PoissonNoise::setThreshold(PoissonNoise *this)

{
  NoiseSource *pNVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  pNVar1 = (this->super_Noise).pParent;
  lVar2 = (long)pNVar1->nNoises;
  dVar5 = 0.0;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      dVar4 = pNVar1->aA[(this->super_Noise).nIndex][lVar3];
      dVar5 = dVar5 + dVar4 * dVar4;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    dVar5 = dVar5 + dVar5;
  }
  dVar4 = erfinv((this->super_Noise).noiseRate * -2.0 *
                 ((this->super_Noise).super_StochasticVariable.super_StochasticProcess.
                  super_TimeDependent.xTime)->dt + 1.0);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  this->poissonThreshold = dVar4 * dVar5;
  return;
}

Assistant:

void PoissonNoise::setThreshold()
{
	double var = pParent->getIndicatorVariance(nIndex);
	poissonThreshold = erfinv(1.0 - 2.0*noiseRate*xTime->dt) * sqrt(2*var);
//	cout << "threshold " << dThreshold << " for rate " << noiseRate << " with indicator variance " << var << endl;
}